

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O2

void test_dt_date(void)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  XSValue_Data *pXVar4;
  XSValue *pXVar5;
  char *pcVar6;
  wchar16 *pwVar7;
  long lVar8;
  void *pvVar9;
  int iVar10;
  Status myStatus;
  StrX local_420;
  Status myStatus_12;
  char iv_3 [11];
  char iv_2 [11];
  char iv_1 [11];
  char v_2 [12];
  char v_3 [18];
  char v_1 [18];
  char r_1 [11];
  char v_1_canrep [11];
  char c_1 [14];
  char r_8 [12];
  char r_3 [12];
  char r_2 [12];
  char c_2 [15];
  char v_2_canrep [12];
  char c_c [19];
  char c_b [19];
  char c_a [19];
  char c_9 [19];
  char c_8 [19];
  char c_7 [19];
  char c_6 [19];
  char c_5 [19];
  char c_4 [19];
  char c_3 [19];
  char r_c [17];
  char r_b [17];
  char r_a [17];
  char r_9 [17];
  char r_7 [17];
  char r_6 [17];
  char r_5 [17];
  char r_4 [17];
  char v_3_canrep [18];
  undefined8 local_a8;
  undefined8 local_80;
  undefined8 local_58;
  int iVar11;
  
  builtin_strncpy(v_1,"   1991-05-31   \n",0x12);
  builtin_strncpy(v_2 + 8,"30Z",4);
  builtin_strncpy(v_2,"9999-06-",8);
  builtin_strncpy(v_3,"99991-07-31+14:00",0x12);
  builtin_strncpy(iv_1,"2000-12-32",0xb);
  builtin_strncpy(iv_2,"2001-02-29",0xb);
  builtin_strncpy(iv_3,"2001-06-31",0xb);
  builtin_strncpy(v_1_canrep,"1991-05-31",0xb);
  builtin_strncpy(v_2_canrep + 8,"30Z",4);
  builtin_strncpy(v_2_canrep,"9999-06-",8);
  builtin_strncpy(v_3_canrep,"99991-07-30-10:00",0x12);
  builtin_strncpy(c_1 + 8,"-31  ",6);
  builtin_strncpy(c_1," 1993-05",8);
  builtin_strncpy(r_1,"1993-05-31",0xb);
  builtin_strncpy(c_2," 1993-05-31Z  ",0xf);
  builtin_strncpy(r_2 + 8,"31Z",4);
  builtin_strncpy(r_2,"1993-05-",8);
  builtin_strncpy(c_3," 1993-05-31+00:00 ",0x13);
  builtin_strncpy(r_3 + 8,"31Z",4);
  builtin_strncpy(r_3,"1993-05-",8);
  builtin_strncpy(c_4," 1993-05-31+00:01 ",0x13);
  builtin_strncpy(r_4,"1993-05-31+00:01",0x11);
  builtin_strncpy(c_5," 1993-05-31+12:00 ",0x13);
  builtin_strncpy(r_5,"1993-05-31+12:00",0x11);
  builtin_strncpy(c_6," 1994-01-01+12:01 ",0x13);
  builtin_strncpy(r_6,"1993-12-31-11:59",0x11);
  builtin_strncpy(c_7," 1994-01-01+14:00 ",0x13);
  builtin_strncpy(r_7,"1993-12-31-10:00",0x11);
  builtin_strncpy(c_8," 1993-06-01-00:00 ",0x13);
  builtin_strncpy(r_8,"1993-06-01Z",0xc);
  builtin_strncpy(c_9," 1993-06-01-00:01 ",0x13);
  builtin_strncpy(r_9,"1993-06-01-00:01",0x11);
  builtin_strncpy(c_a," 1993-06-01-11:59 ",0x13);
  builtin_strncpy(r_a,"1993-06-01-11:59",0x11);
  builtin_strncpy(c_b," 1993-05-31-12:00 ",0x13);
  builtin_strncpy(r_b,"1993-06-01+12:00",0x11);
  builtin_strncpy(c_c," 1993-05-31-14:00 ",0x13);
  builtin_strncpy(r_c,"1993-06-01+10:00",0x11);
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_420,v_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_420.fUnicodeForm,dt_date,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_420);
  if (cVar2 == '\0') {
    StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xece,v_1,local_420.fLocalForm,1);
    StrX::~StrX(&local_420);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_420,v_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_420.fUnicodeForm,dt_date,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_420);
  if (cVar2 == '\0') {
    StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xecf,v_2,local_420.fLocalForm,1);
    StrX::~StrX(&local_420);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_420,v_3);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_420.fUnicodeForm,dt_date,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_420);
  if (cVar2 == '\0') {
    StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xed0,v_3,local_420.fLocalForm,1);
    StrX::~StrX(&local_420);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_420,iv_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_420.fUnicodeForm,dt_date,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_420);
  if (cVar2 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      pcVar1 = local_420.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xed3,iv_1,pcVar1,"st_FOCA0002",pcVar6);
      goto LAB_0011e1f6;
    }
  }
  else {
    StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xed3,iv_1,local_420.fLocalForm,0);
LAB_0011e1f6:
    StrX::~StrX(&local_420);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_420,iv_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_420.fUnicodeForm,dt_date,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_420);
  if (cVar2 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      pcVar1 = local_420.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xed4,iv_2,pcVar1,"st_FOCA0002",pcVar6);
      goto LAB_0011e2ce;
    }
  }
  else {
    StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xed4,iv_2,local_420.fLocalForm,0);
LAB_0011e2ce:
    StrX::~StrX(&local_420);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_420,iv_3);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_420.fUnicodeForm,dt_date,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_420);
  if (cVar2 == '\0') {
    if (myStatus == st_FOCA0002) goto LAB_0011e3ac;
    StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    pcVar1 = local_420.fLocalForm;
    pcVar6 = getStatusString(myStatus);
    printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0xed5,iv_3,pcVar1,"st_FOCA0002",pcVar6);
  }
  else {
    StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xed5,iv_3,local_420.fLocalForm,0);
  }
  StrX::~StrX(&local_420);
  errSeen = 1;
LAB_0011e3ac:
  iVar11 = 2;
  while (iVar10 = iVar11 + -1, iVar11 != 0) {
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_420,v_1);
    pvVar9 = (void *)0x8;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_420.fUnicodeForm,dt_date,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_420);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xeef,v_1);
      StrX::~StrX(&local_420);
      errSeen = 1;
    }
    else {
      bVar3 = compareActualValue(dt_date,*pXVar4,
                                 (XSValue_Data)
                                 ZEXT2440(CONCAT816(0x1f,CONCAT88(0x5000007c7,local_58))));
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_420,v_2);
    pvVar9 = (void *)0x8;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_420.fUnicodeForm,dt_date,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_420);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xef0,v_2);
      StrX::~StrX(&local_420);
      errSeen = 1;
    }
    else {
      bVar3 = compareActualValue(dt_date,*pXVar4,
                                 (XSValue_Data)
                                 ZEXT2440(CONCAT816(0x1e,CONCAT88(0x60000270f,local_80))));
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_420,v_3);
    pvVar9 = (void *)0x8;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_420.fUnicodeForm,dt_date,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_420);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xef1,v_3);
      StrX::~StrX(&local_420);
      errSeen = 1;
    }
    else {
      bVar3 = compareActualValue(dt_date,*pXVar4,
                                 (XSValue_Data)
                                 ZEXT2440(CONCAT816(0x1e,CONCAT88(0x700018697,local_a8))));
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_420,iv_1);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_420.fUnicodeForm,dt_date,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_420);
    if (pXVar5 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        pcVar1 = local_420.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xef4,iv_1,pcVar1,"st_FOCA0002",pcVar6);
        StrX::~StrX(&local_420);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      pvVar9 = (void *)0xef4;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xef4,iv_1);
      StrX::~StrX(&local_420);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_420,iv_2);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_420.fUnicodeForm,dt_date,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_420);
    if (pXVar5 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        pcVar1 = local_420.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xef5,iv_2,pcVar1,"st_FOCA0002",pcVar6);
        StrX::~StrX(&local_420);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      pvVar9 = (void *)0xef5;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xef5,iv_2);
      StrX::~StrX(&local_420);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_420,iv_3);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_420.fUnicodeForm,dt_date,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_420);
    iVar11 = iVar10;
    if (pXVar5 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        pcVar1 = local_420.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xef6,iv_3,pcVar1,"st_FOCA0002",pcVar6);
        StrX::~StrX(&local_420);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      pvVar9 = (void *)0xef6;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xef6,iv_3);
      StrX::~StrX(&local_420);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
  }
  iVar11 = 2;
LAB_0011ea1d:
  iVar10 = iVar11 + -1;
  if (iVar11 == 0) {
    return;
  }
  myStatus_12 = st_Init;
  StrX::StrX(&local_420,v_1);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_420.fUnicodeForm,dt_date,&myStatus_12,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_420);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xf12,v_1);
    StrX::~StrX(&local_420);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,v_1_canrep);
    if (!bVar3) {
      StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xf12,v_1,local_420.fLocalForm,_myStatus,v_1_canrep);
      StrX::~StrX(&local_420);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_12 = st_Init;
  StrX::StrX(&local_420,v_2);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_420.fUnicodeForm,dt_date,&myStatus_12,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_420);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xf13,v_2);
    StrX::~StrX(&local_420);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,v_2_canrep);
    if (!bVar3) {
      StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xf13,v_2,local_420.fLocalForm,_myStatus,v_2_canrep);
      StrX::~StrX(&local_420);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_12 = st_Init;
  StrX::StrX(&local_420,v_3);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_420.fUnicodeForm,dt_date,&myStatus_12,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_420);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xf14,v_3);
    StrX::~StrX(&local_420);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,v_3_canrep);
    if (!bVar3) {
      StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xf14,v_3,local_420.fLocalForm,_myStatus,v_3_canrep);
      StrX::~StrX(&local_420);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_12 = st_Init;
  StrX::StrX(&local_420,c_1);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_420.fUnicodeForm,dt_date,&myStatus_12,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_420);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xf16,c_1);
    StrX::~StrX(&local_420);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,r_1);
    if (!bVar3) {
      StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xf16,c_1,local_420.fLocalForm,_myStatus,r_1);
      StrX::~StrX(&local_420);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_12 = st_Init;
  StrX::StrX(&local_420,c_2);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_420.fUnicodeForm,dt_date,&myStatus_12,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_420);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xf17,c_2);
    StrX::~StrX(&local_420);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,r_2);
    if (!bVar3) {
      StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xf17,c_2,local_420.fLocalForm,_myStatus,r_2);
      StrX::~StrX(&local_420);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_12 = st_Init;
  StrX::StrX(&local_420,c_3);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_420.fUnicodeForm,dt_date,&myStatus_12,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_420);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xf18,c_3);
    StrX::~StrX(&local_420);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,r_3);
    if (!bVar3) {
      StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xf18,c_3,local_420.fLocalForm,_myStatus,r_3);
      StrX::~StrX(&local_420);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_12 = st_Init;
  StrX::StrX(&local_420,c_4);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_420.fUnicodeForm,dt_date,&myStatus_12,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_420);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xf19,c_4);
    StrX::~StrX(&local_420);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,r_4);
    if (!bVar3) {
      StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xf19,c_4,local_420.fLocalForm,_myStatus,r_4);
      StrX::~StrX(&local_420);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_12 = st_Init;
  StrX::StrX(&local_420,c_5);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_420.fUnicodeForm,dt_date,&myStatus_12,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_420);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xf1a,c_5);
    StrX::~StrX(&local_420);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,r_5);
    if (!bVar3) {
      StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xf1a,c_5,local_420.fLocalForm,_myStatus,r_5);
      StrX::~StrX(&local_420);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_12 = st_Init;
  StrX::StrX(&local_420,c_6);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_420.fUnicodeForm,dt_date,&myStatus_12,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_420);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xf1b,c_6);
    StrX::~StrX(&local_420);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,r_6);
    if (!bVar3) {
      StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xf1b,c_6,local_420.fLocalForm,_myStatus,r_6);
      StrX::~StrX(&local_420);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_12 = st_Init;
  StrX::StrX(&local_420,c_7);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_420.fUnicodeForm,dt_date,&myStatus_12,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_420);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xf1c,c_7);
    StrX::~StrX(&local_420);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,r_7);
    if (!bVar3) {
      StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xf1c,c_7,local_420.fLocalForm,_myStatus,r_7);
      StrX::~StrX(&local_420);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_12 = st_Init;
  StrX::StrX(&local_420,c_8);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_420.fUnicodeForm,dt_date,&myStatus_12,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_420);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xf1d,c_8);
    StrX::~StrX(&local_420);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,r_8);
    if (!bVar3) {
      StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xf1d,c_8,local_420.fLocalForm,_myStatus,r_8);
      StrX::~StrX(&local_420);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_12 = st_Init;
  StrX::StrX(&local_420,c_9);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_420.fUnicodeForm,dt_date,&myStatus_12,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_420);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xf1e,c_9);
    StrX::~StrX(&local_420);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,r_9);
    if (!bVar3) {
      StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xf1e,c_9,local_420.fLocalForm,_myStatus,r_9);
      StrX::~StrX(&local_420);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_12 = st_Init;
  StrX::StrX(&local_420,c_a);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_420.fUnicodeForm,dt_date,&myStatus_12,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_420);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xf1f,c_a);
    StrX::~StrX(&local_420);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,r_a);
    if (!bVar3) {
      StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xf1f,c_a,local_420.fLocalForm,_myStatus,r_a);
      StrX::~StrX(&local_420);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_12 = st_Init;
  StrX::StrX(&local_420,c_b);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_420.fUnicodeForm,dt_date,&myStatus_12,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_420);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xf20,c_b);
    StrX::~StrX(&local_420);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,r_b);
    if (!bVar3) {
      StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xf20,c_b,local_420.fLocalForm,_myStatus,r_b);
      StrX::~StrX(&local_420);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_12 = st_Init;
  StrX::StrX(&local_420,c_c);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_420.fUnicodeForm,dt_date,&myStatus_12,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_420);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xf21,c_c);
    StrX::~StrX(&local_420);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,r_c);
    if (!bVar3) {
      StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xf21,c_c,local_420.fLocalForm,_myStatus,r_c);
      StrX::~StrX(&local_420);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_420,iv_1);
  lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_420.fUnicodeForm,dt_date,&myStatus,ver_10,iVar11 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_420);
  if (lVar8 == 0) {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      pcVar1 = local_420.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xf24,iv_1,pcVar1,"st_FOCA0002",pcVar6);
      StrX::~StrX(&local_420);
      goto LAB_0011fb75;
    }
  }
  else {
    StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xf24,iv_1);
    StrX::~StrX(&local_420);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
LAB_0011fb75:
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_420,iv_2);
  lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_420.fUnicodeForm,dt_date,&myStatus,ver_10,iVar11 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_420);
  if (lVar8 == 0) {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      pcVar1 = local_420.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xf25,iv_2,pcVar1,"st_FOCA0002",pcVar6);
      StrX::~StrX(&local_420);
      goto LAB_0011fc60;
    }
  }
  else {
    StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xf25,iv_2);
    StrX::~StrX(&local_420);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
LAB_0011fc60:
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_420,iv_3);
  lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_420.fUnicodeForm,dt_date,&myStatus,ver_10,iVar11 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_420);
  iVar11 = iVar10;
  if (lVar8 == 0) goto LAB_0011fcf1;
  StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
  printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
         ,0xf26,iv_3);
  StrX::~StrX(&local_420);
  (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
            (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
  goto LAB_0011fd49;
LAB_0011fcf1:
  if (myStatus != st_FOCA0002) {
    StrX::StrX(&local_420,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    pcVar1 = local_420.fLocalForm;
    pcVar6 = getStatusString(myStatus);
    printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0xf26,iv_3,pcVar1,"st_FOCA0002",pcVar6);
    StrX::~StrX(&local_420);
LAB_0011fd49:
    errSeen = 1;
  }
  goto LAB_0011ea1d;
}

Assistant:

void test_dt_date()
{
    const XSValue::DataType dt = XSValue::dt_date;
    bool  toValidate = true;

    const char v_1[]="   1991-05-31   \n";
    const char v_2[]="9999-06-30Z";
    const char v_3[]="99991-07-31+14:00";

    const char iv_1[]="2000-12-32";
    const char iv_2[]="2001-02-29";
    const char iv_3[]="2001-06-31";

    XSValue::XSValue_Data act_v_ran_v_1;
    XSValue::XSValue_Data act_v_ran_v_2;
    XSValue::XSValue_Data act_v_ran_v_3;

    const char v_1_canrep[]="1991-05-31";
    const char v_2_canrep[]="9999-06-30Z";
    const char v_3_canrep[]="99991-07-30-10:00";

    /*
     * Case Date               Actual Value    Canonical Value
     *    1 yyyy-mm-dd         yyyy-mm-dd          yyyy-mm-dd
     *    2 yyyy-mm-ddZ        yyyy-mm-ddT00:00Z   yyyy-mm-ddZ
     *    3 yyyy-mm-dd+00:00   yyyy-mm-ddT00:00Z   yyyy-mm-ddZ
     *    4 yyyy-mm-dd+00:01   YYYY-MM-DCT23:59Z   yyyy-mm-dd+00:01
     *    5 yyyy-mm-dd+12:00   YYYY-MM-DCT12:00Z   yyyy-mm-dd+12:00
     *    6 yyyy-mm-dd+12:01   YYYY-MM-DCT11:59Z   YYYY-MM-DC-11:59
     *    7 yyyy-mm-dd+14:00   YYYY-MM-DCT10:00Z   YYYY-MM-DC-10:00
     *    8 yyyy-mm-dd-00:00   yyyy-mm-ddT00:00Z   yyyy-mm-ddZ
     *    9 yyyy-mm-dd-00:01   yyyy-mm-ddT00:01Z   yyyy-mm-dd-00:01
     *   11 yyyy-mm-dd-11:59   yyyy-mm-ddT11:59Z   YYYY-MM-DD-11:59
     *   10 yyyy-mm-dd-12:00   yyyy-mm-ddT12:00Z   YYYY-MM-DD+12:00
     *   12 yyyy-mm-dd-14:00   yyyy-mm-ddT14:00Z   YYYY-MM-DD+10:00
     */

    const char c_1[] = " 1993-05-31  ";       const char r_1[] = "1993-05-31";
    const char c_2[] = " 1993-05-31Z  ";      const char r_2[] = "1993-05-31Z";
    const char c_3[] = " 1993-05-31+00:00 ";  const char r_3[] = "1993-05-31Z";
    const char c_4[] = " 1993-05-31+00:01 ";  const char r_4[] = "1993-05-31+00:01";
    const char c_5[] = " 1993-05-31+12:00 ";  const char r_5[] = "1993-05-31+12:00";
    const char c_6[] = " 1994-01-01+12:01 ";  const char r_6[] = "1993-12-31-11:59";
    const char c_7[] = " 1994-01-01+14:00 ";  const char r_7[] = "1993-12-31-10:00";
    const char c_8[] = " 1993-06-01-00:00 ";  const char r_8[] = "1993-06-01Z";
    const char c_9[] = " 1993-06-01-00:01 ";  const char r_9[] = "1993-06-01-00:01";
    const char c_a[] = " 1993-06-01-11:59 ";  const char r_a[] = "1993-06-01-11:59";
    const char c_b[] = " 1993-05-31-12:00 ";  const char r_b[] = "1993-06-01+12:00";
    const char c_c[] = " 1993-05-31-14:00 ";  const char r_c[] = "1993-06-01+10:00";

    act_v_ran_v_1.fValue.f_datetime.f_year    = 1991;
    act_v_ran_v_1.fValue.f_datetime.f_month   = 05;
    act_v_ran_v_1.fValue.f_datetime.f_day     = 31;
    act_v_ran_v_1.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_1.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_1.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_1.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_2.fValue.f_datetime.f_year    = 9999;
    act_v_ran_v_2.fValue.f_datetime.f_month   = 06;
    act_v_ran_v_2.fValue.f_datetime.f_day     = 30;
    act_v_ran_v_2.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_2.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_2.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_2.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_3.fValue.f_datetime.f_year    = 99991;
    act_v_ran_v_3.fValue.f_datetime.f_month   = 07;
    act_v_ran_v_3.fValue.f_datetime.f_day     = 30;
    act_v_ran_v_3.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_3.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_3.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_3.fValue.f_datetime.f_milisec = 0;

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                                     false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_2, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_3, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_3, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                          XMLCh            st_NoCanRep
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XMLCh            st_NoCanRep
     *   invalid                                          0              st_NoCanRep
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_TRUE, v_1_canrep, DONT_CARE);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_TRUE, v_2_canrep, DONT_CARE);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_TRUE, v_3_canrep, DONT_CARE);

        CANREP_TEST(c_1,  dt, toValidate, EXP_RET_CANREP_TRUE, r_1, DONT_CARE);
        CANREP_TEST(c_2,  dt, toValidate, EXP_RET_CANREP_TRUE, r_2, DONT_CARE);
        CANREP_TEST(c_3,  dt, toValidate, EXP_RET_CANREP_TRUE, r_3, DONT_CARE);
        CANREP_TEST(c_4,  dt, toValidate, EXP_RET_CANREP_TRUE, r_4, DONT_CARE);
        CANREP_TEST(c_5,  dt, toValidate, EXP_RET_CANREP_TRUE, r_5, DONT_CARE);
        CANREP_TEST(c_6,  dt, toValidate, EXP_RET_CANREP_TRUE, r_6, DONT_CARE);
        CANREP_TEST(c_7,  dt, toValidate, EXP_RET_CANREP_TRUE, r_7, DONT_CARE);
        CANREP_TEST(c_8,  dt, toValidate, EXP_RET_CANREP_TRUE, r_8, DONT_CARE);
        CANREP_TEST(c_9,  dt, toValidate, EXP_RET_CANREP_TRUE, r_9, DONT_CARE);
        CANREP_TEST(c_a,  dt, toValidate, EXP_RET_CANREP_TRUE, r_a, DONT_CARE);
        CANREP_TEST(c_b,  dt, toValidate, EXP_RET_CANREP_TRUE, r_b, DONT_CARE);
        CANREP_TEST(c_c,  dt, toValidate, EXP_RET_CANREP_TRUE, r_c, DONT_CARE);

        //  invalid
        CANREP_TEST(iv_1, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
        CANREP_TEST(iv_2, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
        CANREP_TEST(iv_3, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);

    }

}